

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.cpp
# Opt level: O3

bool OpenMD::hasDuplicateElement<std::vector<int,std::allocator<int>>>
               (vector<int,_std::allocator<int>_> *cont)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  long lVar4;
  ulong uVar5;
  int *piVar6;
  int *piVar7;
  int iVar8;
  int *piVar9;
  const_iterator __cbeg;
  pointer piVar10;
  pointer piVar11;
  vector<int,_std::allocator<int>_> tmp;
  vector<int,_std::allocator<int>_> local_38;
  
  std::vector<int,_std::allocator<int>_>::vector(&local_38,cont);
  piVar2 = local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar10 = local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  piVar11 = local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar5 = (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    lVar4 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (piVar10,piVar2);
    piVar10 = local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start;
    piVar11 = local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish;
    if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      piVar9 = local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
      do {
        piVar6 = piVar9;
        if (piVar6 == local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish) goto LAB_002039f9;
        piVar9 = piVar6 + 1;
      } while (piVar6[-1] != *piVar6);
      piVar7 = piVar6 + -1;
      iVar8 = piVar6[-1];
      for (; piVar9 != local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish; piVar9 = piVar9 + 1) {
        iVar1 = *piVar9;
        if (iVar8 != iVar1) {
          piVar7[1] = iVar1;
          piVar7 = piVar7 + 1;
        }
        iVar8 = iVar1;
      }
      piVar7 = piVar7 + 1;
      if (piVar7 != local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
        piVar11 = piVar7;
        local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = piVar7;
      }
    }
  }
LAB_002039f9:
  piVar2 = (cont->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar3 = (cont->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar10 != (int *)0x0) {
    operator_delete(piVar10,(long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage - (long)piVar10);
  }
  return (long)piVar11 - (long)piVar10 != (long)piVar3 - (long)piVar2;
}

Assistant:

bool hasDuplicateElement(const ContainerType& cont) {
    ContainerType tmp = cont;
    std::sort(tmp.begin(), tmp.end());
    tmp.erase(std::unique(tmp.begin(), tmp.end()), tmp.end());
    return tmp.size() != cont.size();
  }